

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetWindowPos(ImGuiWindow *window,ImVec2 *pos,ImGuiCond cond)

{
  uint in_EDX;
  long in_RDI;
  ImVec2 old_pos;
  ImVec2 *in_stack_ffffffffffffffb8;
  ImVec2 *lhs;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_1c [2];
  long local_8;
  
  if ((in_EDX == 0) || ((*(uint *)(in_RDI + 0xb0) & in_EDX) != 0)) {
    *(uint *)(in_RDI + 0xb0) = *(uint *)(in_RDI + 0xb0) & 0xfffffff1;
    local_8 = in_RDI;
    ImVec2::ImVec2(local_1c,3.4028235e+38,3.4028235e+38);
    *(ImVec2 *)(local_8 + 0xbc) = local_1c[0];
    local_28 = *(ImVec2 *)(local_8 + 0x10);
    local_30 = ImFloor(in_stack_ffffffffffffffb8);
    *(ImVec2 *)(local_8 + 0x10) = local_30;
    lhs = &local_28;
    local_38 = operator-(lhs,(ImVec2 *)0x13e92f);
    operator+=((ImVec2 *)(local_8 + 0xd0),&local_38);
    local_40 = operator-(lhs,(ImVec2 *)0x13e95d);
    operator+=((ImVec2 *)(local_8 + 0xe8),&local_40);
  }
  return;
}

Assistant:

static void SetWindowPos(ImGuiWindow* window, const ImVec2& pos, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowPosAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowPosAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);
    window->SetWindowPosVal = ImVec2(FLT_MAX, FLT_MAX);

    // Set
    const ImVec2 old_pos = window->Pos;
    window->Pos = ImFloor(pos);
    window->DC.CursorPos += (window->Pos - old_pos);    // As we happen to move the window while it is being appended to (which is a bad idea - will smear) let's at least offset the cursor
    window->DC.CursorMaxPos += (window->Pos - old_pos); // And more importantly we need to adjust this so size calculation doesn't get affected.
}